

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::initializeMatrix
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,size_t outerSize,double *vector,
          size_t vectorSize)

{
  undefined8 uVar1;
  VectorDynSize *in_RCX;
  ulong uVar2;
  long in_RDX;
  size_type in_RDI;
  double dVar3;
  undefined1 auVar4 [16];
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  size_t i;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  VectorDynSize *this_00;
  size_type __n;
  
  __n = in_RDI;
  std::vector<int,_std::allocator<int>_>::assign
            (in_stack_ffffffffffffffd0,in_RDI,(value_type *)0x7760e0);
  for (this_00 = (VectorDynSize *)0x0; this_00 < in_RCX;
      this_00 = (VectorDynSize *)((long)&this_00->_vptr_VectorDynSize + 1)) {
    uVar1 = *(undefined8 *)(in_RDI + 0x50);
    auVar4._8_4_ = (int)((ulong)uVar1 >> 0x20);
    auVar4._0_8_ = uVar1;
    auVar4._12_4_ = 0x45300000;
    dVar3 = (auVar4._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0) +
            *(double *)(in_RDX + (long)this_00 * 8);
    uVar2 = (ulong)dVar3;
    *(ulong *)(in_RDI + 0x50) = uVar2 | (long)(dVar3 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
  }
  VectorDynSize::reserve(this_00,in_RDI);
  std::vector<int,_std::allocator<int>_>::reserve(unaff_retaddr,__n);
  return;
}

Assistant:

void SparseMatrix<ordering>::initializeMatrix(std::size_t outerSize, const double* vector, std::size_t vectorSize)
    {
        m_outerStarts.assign(outerSize + 1, 0);

        for (std::size_t i = 0; i < vectorSize; ++i) {
            m_allocatedSize += vector[i];
        }

        m_values.reserve(m_allocatedSize);

        // Inner indeces has same size of values
        m_innerIndices.reserve(m_allocatedSize);
    }